

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree_node.cpp
# Opt level: O0

void __thiscall b_tree_node::_insert_non_full(b_tree_node *this,int64_t k,int64_t v)

{
  pager *p;
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  runtime_error *this_00;
  int64_t iVar4;
  undefined1 local_108 [8];
  b_tree_node new_child;
  b_tree_node child;
  int local_24;
  int i;
  int64_t v_local;
  int64_t k_local;
  b_tree_node *this_local;
  
  uVar2 = _num_keys(this);
  local_24 = uVar2 - 1;
  bVar1 = _leaf(this);
  if (bVar1) {
    while( true ) {
      bVar1 = false;
      if (-1 < local_24) {
        bVar1 = k < this->_keys_field[local_24];
      }
      if (!bVar1) break;
      this->_keys_field[local_24 + 1] = this->_keys_field[local_24];
      this->_valid_keys_field[local_24 + 1] = this->_valid_keys_field[local_24];
      this->_vals_field[local_24 + 1] = this->_vals_field[local_24];
      local_24 = local_24 + -1;
    }
    if (((-1 < local_24) && (this->_keys_field[local_24] == k)) &&
       (this->_valid_keys_field[local_24] == '\x01')) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Duplicate key");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->_keys_field[local_24 + 1] = k;
    this->_valid_keys_field[local_24 + 1] = '\x01';
    this->_vals_field[local_24 + 1] = v;
    uVar2 = _num_keys(this);
    _set_num_keys(this,uVar2 + 1);
  }
  else {
    while( true ) {
      bVar1 = false;
      if (-1 < local_24) {
        bVar1 = k < this->_keys_field[local_24];
      }
      if (!bVar1) break;
      local_24 = local_24 + -1;
    }
    p = this->_p;
    iVar4 = _child_ofs(this,(short)local_24 + 1);
    b_tree_node((b_tree_node *)&new_child._child_ofs_field,p,iVar4);
    uVar2 = _num_keys((b_tree_node *)&new_child._child_ofs_field);
    uVar3 = _min_degree(this);
    if ((uint)uVar2 == (uint)uVar3 * 2 - 1) {
      iVar4 = _child_ofs(this,(uint16_t)(local_24 + 1));
      _split_child(this,local_24 + 1,iVar4);
      if (this->_keys_field[local_24 + 1] < k) {
        local_24 = local_24 + 1;
      }
    }
    b_tree_node((b_tree_node *)local_108,this->_p,this->_child_ofs_field[(long)local_24 + 1]);
    _insert_non_full((b_tree_node *)local_108,k,v);
    ~b_tree_node((b_tree_node *)local_108);
    ~b_tree_node((b_tree_node *)&new_child._child_ofs_field);
  }
  return;
}

Assistant:

void b_tree_node::_insert_non_full(int64_t k, int64_t v)
{
    // Initialize index as index of rightmost element
    int i = _num_keys()-1;
 
    // If this is a leaf node
    if (_leaf())
    {
        // The following loop does two things
        // a) Finds the location of new key to be inserted
        // b) Moves all greater keys to one place ahead
        while (i >= 0 && _keys_field[i] > k)
        {
            _keys_field[i+1] = _keys_field[i];
            _valid_keys_field[i+1] = _valid_keys_field[i];
            _vals_field[i+1] = _vals_field[i];
            i--;
        }

        if(i >= 0 && (_keys_field[i] == k && _valid_keys_field[i] == 1))
            throw runtime_error("Duplicate key");
 
        // Insert the new key at found location
        _keys_field[i+1] = k;
        _valid_keys_field[i+1] = 1;
        _vals_field[i+1] = v;
        _set_num_keys(_num_keys() + 1);
    }
    else // If this node is not leaf
    {
        // Find the child which is going to have the new key
        while (i >= 0 && _keys_field[i] > k)
            i--;
 
        b_tree_node child(_p, _child_ofs(i+1));
        // See if the found child is full
        if (child._num_keys() == 2*_min_degree() - 1)
        {
            // If the child is full, then split it
            _split_child(i+1, _child_ofs(i+1));
 
            // After split, the middle key of _child_ofs[i] goes up and
            // _child_ofs[i] is splitted into two.  See which of the two
            // is going to have the new key
            if (_keys_field[i+1] < k)
                i++;
        }

        b_tree_node new_child(_p, _child_ofs_field[i+1]);
        new_child._insert_non_full(k, v);
    }
}